

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraint.c
# Opt level: O1

Constraint * create_less_than_value_constraint(intptr_t expected_value,char *expected_value_name)

{
  Constraint *pCVar1;
  char *pcVar2;
  CgreenValue local_30;
  
  make_cgreen_integer_value(&local_30,expected_value);
  pCVar1 = (Constraint *)malloc(0x80);
  pCVar1->destroy = destroy_empty_constraint;
  pCVar1->failure_message = failure_message_for;
  pCVar1->expected_value_name = (char *)0x0;
  pCVar1->parameter_name = (char *)0x0;
  pCVar1->actual_value_message = "\n\t\tactual value:\t\t\t[%ld]";
  pCVar1->expected_value_message = "\t\texpected value:\t\t\t[%ld]";
  (pCVar1->expected_value).type = local_30.type;
  *(undefined4 *)&(pCVar1->expected_value).field_0x4 = local_30._4_4_;
  (pCVar1->expected_value).value = local_30.value;
  (pCVar1->expected_value).value_size = local_30.value_size;
  pcVar2 = string_dup(expected_value_name);
  pCVar1->expected_value_name = pcVar2;
  pCVar1->type = CGREEN_VALUE_COMPARER_CONSTRAINT;
  pCVar1->compare = compare_want_lesser_value;
  pCVar1->execute = test_true;
  pCVar1->name = "be less than";
  pCVar1->expected_value_message = "\t\texpected to be less than:\t[%ld]";
  pCVar1->size_of_expected_value = 8;
  return pCVar1;
}

Assistant:

Constraint *create_less_than_value_constraint(intptr_t expected_value, const char *expected_value_name) {
    Constraint *constraint = create_constraint_expecting(make_cgreen_integer_value(expected_value), expected_value_name);
    constraint->type = CGREEN_VALUE_COMPARER_CONSTRAINT;

    constraint->compare = &compare_want_lesser_value;
    constraint->execute = &test_true;
    constraint->name = "be less than";
    constraint->expected_value_message = "\t\texpected to be less than:\t[%" PRIdPTR "]";
    constraint->size_of_expected_value = sizeof(intptr_t);

    return constraint;
}